

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

void duckdb_je_background_thread_wakeup_early
               (background_thread_info_t *info,nstime_t *remaining_sleep)

{
  uint64_t uVar1;
  
  if (remaining_sleep != (nstime_t *)0x0) {
    uVar1 = duckdb_je_nstime_ns(remaining_sleep);
    if (uVar1 < 100000000) {
      return;
    }
  }
  pthread_cond_signal((pthread_cond_t *)&info->cond);
  return;
}

Assistant:

void
background_thread_wakeup_early(background_thread_info_t *info,
    nstime_t *remaining_sleep) {
	/*
	 * This is an optimization to increase batching. At this point
	 * we know that background thread wakes up soon, so the time to cache
	 * the just freed memory is bounded and low.
	 */
	if (remaining_sleep != NULL && nstime_ns(remaining_sleep) <
	    BACKGROUND_THREAD_MIN_INTERVAL_NS) {
		return;
	}
	pthread_cond_signal(&info->cond);
}